

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapTest.cpp
# Opt level: O1

void print<std::map<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>>>
               (map<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>_> *t,
               char *s)

{
  long lVar1;
  undefined8 in_RAX;
  size_t sVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  undefined8 uStack_38;
  
  lVar1 = std::cout;
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  uStack_38 = in_RAX;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar1 + -0x18) + 0x1150d0);
  }
  else {
    sVar2 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," contains:",10);
  p_Var4 = (t->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(t->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p_Var4[1]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," => ",4);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&p_Var4[1].field_0x4);
      uStack_38 = CONCAT17(0x29,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_38 + 7),1);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return;
}

Assistant:

void	print(T const & t, char const * s)
{
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << " (" << it->first << " => " << it->second << ')';
	std::cout << std::endl;
}